

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CETime.cpp
# Opt level: O0

void __thiscall test_CETime::test_CETime(test_CETime *this)

{
  CETime *in_RDI;
  CETime *in_stack_ffffffffffffff88;
  CETime *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  CETime *in_stack_ffffffffffffffb0;
  
  CETestSuite::CETestSuite((CETestSuite *)in_RDI);
  in_RDI->_vptr_CETime = (_func_int **)&PTR__test_CETime_0014f588;
  CETime::CETime(in_stack_ffffffffffffffa0);
  CETime::CETime(in_stack_ffffffffffffffb0,
                 (double *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (CETimeType)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  CETime::operator=(in_RDI,in_stack_ffffffffffffff88);
  CETime::~CETime(in_RDI);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffb0,
             (int *)&stack0xffffffffffffffac);
  in_RDI[0xe].time_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffffb0;
  (*in_RDI->_vptr_CETime[6])(in_RDI,&stack0xffffffffffffffa0);
  return;
}

Assistant:

test_CETime::test_CETime() :
    CETestSuite()
{
    // Create the base objects for comparison
    base_    = CETime(123456.789, CETimeType::UTC);
    naptime_ = std::chrono::milliseconds(500);

    SetDblTol(1e-11);
    // pause execution to give the the date time to run
    //std::this_thread::sleep_for(naptime_);
}